

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O2

int dog_nutrition(monst *mtmp,obj *obj)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  unsigned_short *puVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  if (obj->oclass == '\f') {
    iVar5 = obj->quan;
    iVar7 = 1;
    if (-4000 < iVar5) {
      iVar7 = iVar5 / 2000 + 1;
    }
    mtmp->meating = iVar7;
    if (0 < iVar5 / 0x14) {
      return iVar5 / 0x14;
    }
    return 0;
  }
  if (obj->oclass != '\a') {
    mtmp->meating = obj->owt / 0x14 + 1;
    return (uint)objects[obj->otyp].oc_nutrition + (uint)objects[obj->otyp].oc_nutrition * 4;
  }
  lVar3 = (long)obj->otyp;
  if (lVar3 == 0x10e) {
    puVar4 = &mons[obj->corpsenm].cnutrit;
    iVar5 = (mons[obj->corpsenm].cwt >> 6) + 3;
  }
  else {
    puVar4 = &objects[lVar3].oc_nutrition;
    iVar5 = (int)objects[lVar3].oc_delay;
  }
  mtmp->meating = iVar5;
  uVar2 = *puVar4;
  bVar1 = mtmp->data->msize;
  if (bVar1 < 8) {
    uVar6 = (uint)uVar2;
    switch(bVar1) {
    case 0:
      iVar7 = (uint)uVar2 << 3;
      break;
    case 1:
      iVar7 = uVar6 * 6;
      break;
    default:
      goto switchD_00171648_caseD_2;
    case 3:
      iVar7 = uVar6 << 2;
      break;
    case 4:
      iVar7 = (uint)uVar2 + (uint)uVar2 * 2;
      break;
    case 7:
      iVar7 = uVar6 * 2;
    }
  }
  else {
switchD_00171648_caseD_2:
    iVar7 = (uint)uVar2 + (uint)uVar2 * 4;
  }
  if (obj->oeaten == 0) {
    return iVar7;
  }
  iVar5 = eaten_stat(iVar5,obj);
  mtmp->meating = iVar5;
  iVar5 = eaten_stat(iVar7,obj);
  return iVar5;
}

Assistant:

int dog_nutrition(struct monst *mtmp, struct obj *obj)
{
	int nutrit;

	/*
	 * It is arbitrary that the pet takes the same length of time to eat
	 * as a human, but gets more nutritional value.
	 */
	if (obj->oclass == FOOD_CLASS) {
	    if (obj->otyp == CORPSE) {
		mtmp->meating = 3 + (mons[obj->corpsenm].cwt >> 6);
		nutrit = mons[obj->corpsenm].cnutrit;
	    } else {
		mtmp->meating = objects[obj->otyp].oc_delay;
		nutrit = objects[obj->otyp].oc_nutrition;
	    }
	    switch(mtmp->data->msize) {
		case MZ_TINY: nutrit *= 8; break;
		case MZ_SMALL: nutrit *= 6; break;
		default:
		case MZ_MEDIUM: nutrit *= 5; break;
		case MZ_LARGE: nutrit *= 4; break;
		case MZ_HUGE: nutrit *= 3; break;
		case MZ_GIGANTIC: nutrit *= 2; break;
	    }
	    if (obj->oeaten) {
		mtmp->meating = eaten_stat(mtmp->meating, obj);
		nutrit = eaten_stat(nutrit, obj);
	    }
	} else if (obj->oclass == COIN_CLASS) {
	    mtmp->meating = (int)(obj->quan/2000) + 1;
	    if (mtmp->meating < 0) mtmp->meating = 1;
	    nutrit = (int)(obj->quan/20);
	    if (nutrit < 0) nutrit = 0;
	} else {
	    /* Unusual pet such as gelatinous cube eating odd stuff.
	     * meating made consistent with wild monsters in mon.c.
	     * nutrit made consistent with polymorphed player nutrit in
	     * eat.c.  (This also applies to pets eating gold.)
	     */
	    mtmp->meating = obj->owt/20 + 1;
	    nutrit = 5*objects[obj->otyp].oc_nutrition;
	}
	return nutrit;
}